

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkkDualRow.cpp
# Opt level: O3

void __thiscall HEkkDualRow::choosePossible(HEkkDualRow *this)

{
  double dVar1;
  char cVar2;
  int iVar3;
  int iVar4;
  pointer piVar5;
  int8_t *piVar6;
  double *pdVar7;
  pointer pdVar8;
  pointer ppVar9;
  int iVar10;
  int iVar11;
  long lVar12;
  ulong uVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  
  iVar3 = (this->ekk_instance_->info_).update_count;
  if (iVar3 < 10) {
    dVar14 = 1e-09;
  }
  else {
    dVar14 = *(double *)(&DAT_003d5ee0 + (ulong)(iVar3 < 0x14) * 8);
  }
  dVar1 = (this->ekk_instance_->options_->super_HighsOptionsStruct).dual_feasibility_tolerance;
  this->workTheta = INFINITY;
  this->workCount = 0;
  iVar3 = this->packCount;
  if (0 < (long)iVar3) {
    piVar5 = (this->packIndex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar6 = this->workMove;
    pdVar7 = this->workDual;
    pdVar8 = (this->packValue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    ppVar9 = (this->workData).
             super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
             _M_impl.super__Vector_impl_data._M_start;
    dVar15 = INFINITY;
    lVar12 = 0;
    uVar13 = -(ulong)(this->workDelta < 0.0);
    iVar11 = 0;
    do {
      iVar4 = piVar5[lVar12];
      cVar2 = piVar6[iVar4];
      dVar16 = pdVar8[lVar12];
      dVar16 = (double)(~uVar13 & (ulong)dVar16 | (ulong)-dVar16 & uVar13) * (double)(int)cVar2;
      if (dVar14 < dVar16) {
        iVar10 = iVar11 + 1;
        this->workCount = iVar10;
        ppVar9[iVar11].first = iVar4;
        ppVar9[iVar11].second = dVar16;
        dVar17 = (double)(int)cVar2 * pdVar7[iVar4] + dVar1;
        iVar11 = iVar10;
        if (dVar17 < dVar16 * dVar15) {
          dVar15 = dVar17 / dVar16;
          this->workTheta = dVar15;
        }
      }
      lVar12 = lVar12 + 1;
    } while (iVar3 != lVar12);
  }
  return;
}

Assistant:

void HEkkDualRow::choosePossible() {
  /**
   * Determine the possible variables - candidates for CHUZC
   * TODO: Check with Qi what this is doing
   */
  const double Ta = ekk_instance_.info_.update_count < 10   ? 1e-9
                    : ekk_instance_.info_.update_count < 20 ? 3e-8
                                                            : 1e-6;
  const double Td = ekk_instance_.options_->dual_feasibility_tolerance;
  const HighsInt move_out = workDelta < 0 ? -1 : 1;
  workTheta = kHighsInf;
  workCount = 0;

  for (HighsInt i = 0; i < packCount; i++) {
    const HighsInt iCol = packIndex[i];
    const HighsInt move = workMove[iCol];
    const double alpha = packValue[i] * move_out * move;
    if (alpha > Ta) {
      workData[workCount++] = make_pair(iCol, alpha);
      const double relax = workDual[iCol] * move + Td;
      if (workTheta * alpha > relax) workTheta = relax / alpha;
    }
  }
}